

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefArrayVectorOf<char16_t> **objToLoad,int initSize,bool toAdopt,
               XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  MemoryManager *pMVar3;
  RefArrayVectorOf<char16_t> *this;
  XMLSize_t maxElems;
  char16_t *local_48;
  XMLCh *data;
  XMLSize_t i;
  XMLSize_t vectorSize;
  XSerializeEngine *local_20;
  XSerializeEngine *serEng_local;
  bool toAdopt_local;
  RefArrayVectorOf<char16_t> **ppRStack_10;
  int initSize_local;
  RefArrayVectorOf<char16_t> **objToLoad_local;
  
  local_20 = serEng;
  serEng_local._3_1_ = toAdopt;
  serEng_local._4_4_ = initSize;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    if (*ppRStack_10 == (RefArrayVectorOf<char16_t> *)0x0) {
      if (serEng_local._4_4_ < 0) {
        serEng_local._4_4_ = 0x10;
      }
      pMVar3 = XSerializeEngine::getMemoryManager(local_20);
      this = (RefArrayVectorOf<char16_t> *)XMemory::operator_new(0x30,pMVar3);
      bVar1 = serEng_local._3_1_;
      maxElems = (XMLSize_t)serEng_local._4_4_;
      pMVar3 = XSerializeEngine::getMemoryManager(local_20);
      RefArrayVectorOf<char16_t>::RefArrayVectorOf(this,maxElems,(bool)(bVar1 & 1),pMVar3);
      *ppRStack_10 = this;
    }
    XSerializeEngine::registerObject(local_20,*ppRStack_10);
    i = 0;
    XSerializeEngine::readSize(local_20,&i);
    for (data = (XMLCh *)0x0; data < i; data = (XMLCh *)((long)data + 1)) {
      XSerializeEngine::readString(local_20,&local_48);
      BaseRefVectorOf<char16_t>::addElement
                (&(*ppRStack_10)->super_BaseRefVectorOf<char16_t>,local_48);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefArrayVectorOf<XMLCh>**  objToLoad
                                   , int                        initSize
                                   , bool                       toAdopt
                                   , XSerializeEngine&          serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefArrayVectorOf<XMLCh>(
                                                     initSize
                                                   , toAdopt
                                                   , serEng.getMemoryManager()
                                                   );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorSize = 0;
        serEng.readSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            XMLCh* data;
            serEng.readString(data);
            (*objToLoad)->addElement(data);
        }
    }

}